

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManEquivSetColors(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int nNodes [2];
  
  if ((p->vCos->nSize - p->nRegs & 1U) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x410,"int Gia_ManEquivSetColors(Gia_Man_t *, int)");
  }
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x40000000);
  *p->pReprs = (Gia_Rpr_t)((uint)*p->pReprs | 0x80000000);
  iVar2 = p->nRegs;
  pVVar3 = p->vCis;
  iVar6 = pVVar3->nSize;
  iVar9 = iVar6 - iVar2;
  if (iVar9 != 0 && iVar2 <= iVar6) {
    lVar4 = 0;
    do {
      if (iVar6 <= lVar4) goto LAB_001feba8;
      lVar7 = (long)pVVar3->pArray[lVar4];
      if ((lVar7 < 0) || (p->nObjs <= pVVar3->pArray[lVar4])) goto LAB_001feb89;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0x40000000);
      p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0x80000000);
      lVar4 = lVar4 + 1;
      iVar2 = p->nRegs;
      pVVar3 = p->vCis;
      iVar6 = pVVar3->nSize;
      iVar9 = iVar6 - iVar2;
    } while (lVar4 < iVar9);
  }
  nNodes[0] = iVar9;
  pVVar5 = p->vCos;
  uVar10 = pVVar5->nSize;
  uVar8 = (ulong)uVar10;
  nNodes[1] = nNodes[0];
  if (iVar2 < (int)uVar10) {
    lVar4 = 0;
    do {
      uVar10 = (uint)uVar8;
      if ((int)uVar10 <= lVar4) {
LAB_001feba8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar5->pArray[lVar4];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_001feb89:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      uVar10 = (uint)lVar4 & 1;
      iVar2 = Gia_ManEquivSetColor_rec
                        (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),uVar10);
      nNodes[uVar10] = nNodes[uVar10] + iVar2;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
      uVar10 = pVVar5->nSize;
      uVar8 = (ulong)(int)uVar10;
    } while (lVar4 < (long)(uVar8 - (long)p->nRegs));
    pVVar3 = p->vCis;
  }
  iVar2 = nNodes[1];
  iVar6 = (pVVar3->nSize + p->nObjs + ~(uVar10 + pVVar3->nSize)) * 2 - nNodes[0];
  if (fVerbose != 0) {
    Abc_Print(1,"CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n");
  }
  return (iVar6 - iVar2) / 2;
}

Assistant:

int Gia_ManEquivSetColors( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, nNodes[2], nDiffs[2];
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ObjSetColors( p, 0 );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetColors( p, Gia_ObjId(p,pObj) );
    nNodes[0] = nNodes[1] = Gia_ManPiNum(p);
    Gia_ManForEachPo( p, pObj, i )
        nNodes[i&1] += Gia_ManEquivSetColor_rec( p, Gia_ObjFanin0(pObj), i&1 );
//    Gia_ManForEachObj( p, pObj, i )
//        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
//            assert( Gia_ObjColors(p, i) );
    nDiffs[0] = Gia_ManCandNum(p) - nNodes[0];
    nDiffs[1] = Gia_ManCandNum(p) - nNodes[1];
    if ( fVerbose )
    {
        Abc_Print( 1, "CI+AND = %7d  A = %7d  B = %7d  Ad = %7d  Bd = %7d  AB = %7d.\n",
            Gia_ManCandNum(p), nNodes[0], nNodes[1], nDiffs[0], nDiffs[1],
            Gia_ManCandNum(p) - nDiffs[0] - nDiffs[1] );
    }
    return (nDiffs[0] + nDiffs[1]) / 2;
}